

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::BasicNonMS<tcu::Vector<int,_4>,_4>::Run
          (BasicNonMS<tcu::Vector<int,_4>,_4> *this)

{
  CallLogWrapper *this_00;
  GLenum target;
  long lVar1;
  int i;
  GLenum *pGVar2;
  ImageSizeMachine machine;
  ivec4 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_00 = &(this->super_ShaderImageSizeBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  pGVar2 = &DAT_017594f0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    target = *pGVar2;
    glu::CallLogWrapper::glBindTexture(this_00,target,this->m_texture[lVar1]);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2801,0x2600);
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x2800,0x2600);
    glu::CallLogWrapper::glTexStorage2D(this_00,target,10,0x8d82,0x200,0x80);
    glu::CallLogWrapper::glBindImageTexture(this_00,0,this->m_texture[lVar1],1,'\0',0,35000,0x8d82);
    pGVar2 = pGVar2 + 1;
  }
  ImageSizeMachine::ImageSizeMachine(&machine);
  local_78.m_data[0] = 0x100;
  local_78.m_data[1] = 0x40;
  local_78.m_data[2] = 0;
  local_78.m_data[3] = 0;
  local_68 = 0x800000008;
  uStack_60 = 4;
  local_58 = 0x1000000010;
  uStack_50 = 0;
  local_48 = 0x90000001f;
  uStack_40 = 0xc;
  lVar1 = glcts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
                    ((ImageSizeMachine *)&machine,4,&local_78);
  ImageSizeMachine::~ImageSizeMachine(&machine);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		if (STAGE == 0 && !IsVSFSAvailable(4, 0))
			return NOT_SUPPORTED;
		if (STAGE == 5 && !IsVSFSAvailable(0, 4))
			return NOT_SUPPORTED;

		const GLenum target[4] = { GL_TEXTURE_2D, GL_TEXTURE_3D, GL_TEXTURE_CUBE_MAP, GL_TEXTURE_2D_ARRAY };
		for (int i = 0; i < 4; ++i)
		{
			glBindTexture(target[i], m_texture[i]);
			glTexParameteri(target[i], GL_TEXTURE_MIN_FILTER, GL_NEAREST);
			glTexParameteri(target[i], GL_TEXTURE_MAG_FILTER, GL_NEAREST);

			if (i == 0)
			{
				glTexStorage2D(target[i], 10, TexInternalFormat<T>(), 512, 128);
				glBindImageTexture(0, m_texture[i], 1, GL_FALSE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 1)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 8, 8, 4);
				glBindImageTexture(1, m_texture[i], 0, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
			else if (i == 2)
			{
				glTexStorage2D(target[i], 4, TexInternalFormat<T>(), 16, 16);
				glBindImageTexture(2, m_texture[i], 0, GL_TRUE, 0, GL_READ_WRITE, TexInternalFormat<T>());
			}
			else if (i == 3)
			{
				glTexStorage3D(target[i], 3, TexInternalFormat<T>(), 127, 39, 12);
				glBindImageTexture(3, m_texture[i], 2, GL_TRUE, 0, GL_READ_ONLY, TexInternalFormat<T>());
			}
		}
		ImageSizeMachine machine;
		ivec4			 res[4] = { ivec4(256, 64, 0, 0), ivec4(8, 8, 4, 0), ivec4(16, 16, 0, 0), ivec4(31, 9, 12, 0) };
		return machine.Run<T>(STAGE, res);
	}